

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

size_t __thiscall geometrycentral::surface::SurfaceMesh::nInteriorVertices(SurfaceMesh *this)

{
  size_t sVar1;
  pointer puVar2;
  long lVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  Vertex v;
  Vertex local_40;
  
  sVar1 = this->nVerticesFillCount;
  if ((sVar1 == 0) ||
     (puVar2 = (this->vHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar2 != 0xffffffffffffffff)) {
    sVar7 = 0;
  }
  else {
    sVar5 = 0;
    do {
      sVar7 = sVar1;
      if (sVar1 - 1 == sVar5) break;
      sVar7 = sVar5 + 1;
      lVar3 = sVar5 + 1;
      sVar5 = sVar7;
    } while (puVar2[lVar3] == 0xffffffffffffffff);
  }
  if (sVar7 == sVar1) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    do {
      local_40.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
           this;
      local_40.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
           sVar7;
      bVar4 = Vertex::isBoundary(&local_40);
      sVar5 = !bVar4 + sVar5;
      sVar6 = sVar7;
      do {
        sVar7 = sVar1;
        if (sVar1 - 1 == sVar6) break;
        sVar7 = sVar6 + 1;
        lVar3 = sVar6 + 1;
        sVar6 = sVar7;
      } while ((this->vHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar3] == 0xffffffffffffffff);
    } while (sVar7 != sVar1);
  }
  return sVar5;
}

Assistant:

size_t SurfaceMesh::nInteriorVertices() {
  size_t nInteriorVertices = 0;
  for (const Vertex v : vertices()) {
    if (!v.isBoundary()) {
      nInteriorVertices++;
    }
  }
  return nInteriorVertices;
}